

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

void __thiscall google::protobuf::json_internal::JsonWriter::Write(JsonWriter *this,uint32_t val)

{
  string_view str;
  int iVar1;
  undefined1 local_60 [8];
  string_view view;
  char local_38 [4];
  int len;
  char buf [22];
  uint32_t local_14;
  JsonWriter *pJStack_10;
  uint32_t val_local;
  JsonWriter *this_local;
  
  local_14 = val;
  pJStack_10 = this;
  absl::lts_20240722::str_format_internal::
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355>::FormatSpecTemplate
            ((FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355> *)&view._M_str
             ,"%d");
  iVar1 = absl::lts_20240722::SNPrintF<unsigned_int>
                    (local_38,0x16,(FormatSpec<unsigned_int> *)&view._M_str,&local_14);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_60,local_38,(long)iVar1);
  str._M_str = (char *)view._M_len;
  str._M_len = (size_t)local_60;
  Write(this,str);
  return;
}

Assistant:

void Write(uint32_t val) {
    char buf[22];
    int len = absl::SNPrintF(buf, sizeof(buf), "%d", val);
    absl::string_view view(buf, static_cast<size_t>(len));
    Write(view);
  }